

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_symlink(archive_entry *entry)

{
  wchar_t wVar1;
  int *piVar2;
  archive_mstring *in_RDI;
  char *p;
  char **in_stack_ffffffffffffffe8;
  archive_conflict *in_stack_fffffffffffffff8;
  
  if ((in_RDI[1].aes_mbs_in_locale.buffer_length & 2) == 0) {
    in_stack_ffffffffffffffe8 = (char **)0x0;
  }
  else {
    wVar1 = archive_mstring_get_mbs(in_stack_fffffffffffffff8,in_RDI,in_stack_ffffffffffffffe8);
    if (wVar1 != L'\0') {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        __archive_errx(p._4_4_,(char *)in_stack_fffffffffffffff8);
      }
      in_stack_ffffffffffffffe8 = (char **)0x0;
    }
  }
  return (char *)in_stack_ffffffffffffffe8;
}

Assistant:

const char *
archive_entry_symlink(struct archive_entry *entry)
{
	const char *p;
	if ((entry->ae_set & AE_SET_SYMLINK) == 0)
		return (NULL);
	if (archive_mstring_get_mbs(
	    entry->archive, &entry->ae_symlink, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}